

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O0

void anon_unknown.dwarf_41b5d::UpdateSourceProps(ALsource *source,Voice *voice,ALCcontext *context)

{
  bool bVar1;
  const_iterator head;
  const_iterator pvVar2;
  pointer pAVar3;
  __pointer_type pVVar4;
  atomic<VoicePropsItem_*> *in_RSI;
  float *in_RDI;
  anon_class_1_0_00000001 copy_send;
  VoicePropsItem *next;
  VoicePropsItem *props;
  __pointer_type in_stack_00000048;
  __pointer_type *in_stack_00000050;
  atomic<VoicePropsItem_*> *in_stack_00000058;
  VoicePropsItem *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  atomic<VoicePropsItem_*> *in_stack_ffffffffffffffc8;
  __pointer_type local_20;
  
  local_20 = std::atomic<VoicePropsItem_*>::load
                       (in_stack_ffffffffffffffc8,(memory_order)(in_stack_ffffffffffffffc0 >> 0x20))
  ;
  if (local_20 == (__pointer_type)0x0) {
    local_20 = (__pointer_type)VoicePropsItem::operator_new(in_stack_ffffffffffffffc0);
    memset(local_20,0,0x170);
    VoicePropsItem::VoicePropsItem((VoicePropsItem *)0x1728de);
  }
  else {
    do {
      std::atomic<VoicePropsItem_*>::load
                (in_stack_ffffffffffffffc8,(memory_order)(in_stack_ffffffffffffffc0 >> 0x20));
      bVar1 = std::atomic<VoicePropsItem_*>::compare_exchange_weak
                        (in_stack_00000058,in_stack_00000050,in_stack_00000048,source._4_4_,
                         (memory_order)source);
    } while (!bVar1);
  }
  (local_20->super_VoiceProps).Pitch = *in_RDI;
  (local_20->super_VoiceProps).Gain = in_RDI[1];
  (local_20->super_VoiceProps).OuterGain = in_RDI[2];
  (local_20->super_VoiceProps).MinGain = in_RDI[3];
  (local_20->super_VoiceProps).MaxGain = in_RDI[4];
  (local_20->super_VoiceProps).InnerAngle = in_RDI[5];
  (local_20->super_VoiceProps).OuterAngle = in_RDI[6];
  (local_20->super_VoiceProps).RefDistance = in_RDI[7];
  (local_20->super_VoiceProps).MaxDistance = in_RDI[8];
  (local_20->super_VoiceProps).RolloffFactor = in_RDI[9];
  *(undefined8 *)(local_20->super_VoiceProps).Position._M_elems = *(undefined8 *)(in_RDI + 10);
  (local_20->super_VoiceProps).Position._M_elems[2] = in_RDI[0xc];
  *(undefined8 *)(local_20->super_VoiceProps).Velocity._M_elems = *(undefined8 *)(in_RDI + 0xd);
  (local_20->super_VoiceProps).Velocity._M_elems[2] = in_RDI[0xf];
  *(undefined8 *)(local_20->super_VoiceProps).Direction._M_elems = *(undefined8 *)(in_RDI + 0x10);
  (local_20->super_VoiceProps).Direction._M_elems[2] = in_RDI[0x12];
  *(undefined8 *)(local_20->super_VoiceProps).OrientAt._M_elems = *(undefined8 *)(in_RDI + 0x13);
  (local_20->super_VoiceProps).OrientAt._M_elems[2] = in_RDI[0x15];
  *(undefined8 *)(local_20->super_VoiceProps).OrientUp._M_elems = *(undefined8 *)(in_RDI + 0x16);
  (local_20->super_VoiceProps).OrientUp._M_elems[2] = in_RDI[0x18];
  (local_20->super_VoiceProps).HeadRelative = (bool)(*(byte *)(in_RDI + 0x19) & 1);
  (local_20->super_VoiceProps).mDistanceModel = (DistanceModel)in_RDI[0x1a];
  (local_20->super_VoiceProps).mResampler = (Resampler)in_RDI[0x1b];
  (local_20->super_VoiceProps).DirectChannels = *(DirectMode *)(in_RDI + 0x1c);
  (local_20->super_VoiceProps).mSpatializeMode = *(SpatializeMode *)((long)in_RDI + 0x71);
  (local_20->super_VoiceProps).DryGainHFAuto = (bool)(*(byte *)((long)in_RDI + 0x72) & 1);
  (local_20->super_VoiceProps).WetGainAuto = (bool)(*(byte *)((long)in_RDI + 0x73) & 1);
  (local_20->super_VoiceProps).WetGainHFAuto = (bool)(*(byte *)(in_RDI + 0x1d) & 1);
  (local_20->super_VoiceProps).OuterGainHF = in_RDI[0x1e];
  (local_20->super_VoiceProps).AirAbsorptionFactor = in_RDI[0x1f];
  (local_20->super_VoiceProps).RoomRolloffFactor = in_RDI[0x20];
  (local_20->super_VoiceProps).DopplerFactor = in_RDI[0x21];
  *(undefined8 *)(local_20->super_VoiceProps).StereoPan._M_elems = *(undefined8 *)(in_RDI + 0x22);
  (local_20->super_VoiceProps).Radius = in_RDI[0x24];
  (local_20->super_VoiceProps).Direct.Gain = in_RDI[0x25];
  (local_20->super_VoiceProps).Direct.GainHF = in_RDI[0x26];
  (local_20->super_VoiceProps).Direct.HFReference = in_RDI[0x27];
  (local_20->super_VoiceProps).Direct.GainLF = in_RDI[0x28];
  (local_20->super_VoiceProps).Direct.LFReference = in_RDI[0x29];
  head = std::array<ALsource::SendData,_6UL>::cbegin((array<ALsource::SendData,_6UL> *)0x172c21);
  pvVar2 = std::array<ALsource::SendData,_6UL>::cend((array<ALsource::SendData,_6UL> *)0x172c37);
  std::
  transform<ALsource::SendData_const*,VoiceProps::SendData*,(anonymous_namespace)::UpdateSourceProps(ALsource_const*,Voice*,ALCcontext*)::__0>
            (head,pvVar2,(local_20->super_VoiceProps).Send);
  if (((local_20->super_VoiceProps).Send[0].Slot == (EffectSlot *)0x0) &&
     (bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<ALeffectslot,_std::default_delete<ALeffectslot>_> *)0x172c70),
     bVar1)) {
    pAVar3 = std::unique_ptr<ALeffectslot,_std::default_delete<ALeffectslot>_>::operator->
                       ((unique_ptr<ALeffectslot,_std::default_delete<ALeffectslot>_> *)0x172c87);
    (local_20->super_VoiceProps).Send[0].Slot = &pAVar3->mSlot;
  }
  pVVar4 = std::atomic<VoicePropsItem_*>::exchange(in_RSI,local_20,memory_order_acq_rel);
  if (pVVar4 != (__pointer_type)0x0) {
    AtomicReplaceHead<VoicePropsItem*>((atomic<VoicePropsItem_*> *)head,in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void UpdateSourceProps(const ALsource *source, Voice *voice, ALCcontext *context)
{
    /* Get an unused property container, or allocate a new one as needed. */
    VoicePropsItem *props{context->mFreeVoiceProps.load(std::memory_order_acquire)};
    if(!props)
        props = new VoicePropsItem{};
    else
    {
        VoicePropsItem *next;
        do {
            next = props->next.load(std::memory_order_relaxed);
        } while(context->mFreeVoiceProps.compare_exchange_weak(props, next,
                std::memory_order_acq_rel, std::memory_order_acquire) == 0);
    }

    props->Pitch = source->Pitch;
    props->Gain = source->Gain;
    props->OuterGain = source->OuterGain;
    props->MinGain = source->MinGain;
    props->MaxGain = source->MaxGain;
    props->InnerAngle = source->InnerAngle;
    props->OuterAngle = source->OuterAngle;
    props->RefDistance = source->RefDistance;
    props->MaxDistance = source->MaxDistance;
    props->RolloffFactor = source->RolloffFactor;
    props->Position = source->Position;
    props->Velocity = source->Velocity;
    props->Direction = source->Direction;
    props->OrientAt = source->OrientAt;
    props->OrientUp = source->OrientUp;
    props->HeadRelative = source->HeadRelative;
    props->mDistanceModel = source->mDistanceModel;
    props->mResampler = source->mResampler;
    props->DirectChannels = source->DirectChannels;
    props->mSpatializeMode = source->mSpatialize;

    props->DryGainHFAuto = source->DryGainHFAuto;
    props->WetGainAuto = source->WetGainAuto;
    props->WetGainHFAuto = source->WetGainHFAuto;
    props->OuterGainHF = source->OuterGainHF;

    props->AirAbsorptionFactor = source->AirAbsorptionFactor;
    props->RoomRolloffFactor = source->RoomRolloffFactor;
    props->DopplerFactor = source->DopplerFactor;

    props->StereoPan = source->StereoPan;

    props->Radius = source->Radius;

    props->Direct.Gain = source->Direct.Gain;
    props->Direct.GainHF = source->Direct.GainHF;
    props->Direct.HFReference = source->Direct.HFReference;
    props->Direct.GainLF = source->Direct.GainLF;
    props->Direct.LFReference = source->Direct.LFReference;

    auto copy_send = [](const ALsource::SendData &srcsend) noexcept -> VoiceProps::SendData
    {
        VoiceProps::SendData ret{};
        ret.Slot = srcsend.Slot ? &srcsend.Slot->mSlot : nullptr;
        ret.Gain = srcsend.Gain;
        ret.GainHF = srcsend.GainHF;
        ret.HFReference = srcsend.HFReference;
        ret.GainLF = srcsend.GainLF;
        ret.LFReference = srcsend.LFReference;
        return ret;
    };
    std::transform(source->Send.cbegin(), source->Send.cend(), props->Send, copy_send);
    if(!props->Send[0].Slot && context->mDefaultSlot)
        props->Send[0].Slot = &context->mDefaultSlot->mSlot;

    /* Set the new container for updating internal parameters. */
    props = voice->mUpdate.exchange(props, std::memory_order_acq_rel);
    if(props)
    {
        /* If there was an unused update container, put it back in the
         * freelist.
         */
        AtomicReplaceHead(context->mFreeVoiceProps, props);
    }
}